

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O1

CM_RETURN_STATUS __thiscall
ConfusableMatcher::CheckWordBoundary(ConfusableMatcher *this,CMStringView In,CMStringView Match)

{
  bool bVar1;
  CM_RETURN_STATUS CVar2;
  size_t matchEnd;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  CMStringView In_00;
  CMStringView In_01;
  
  pcVar5 = Match._M_str;
  pcVar6 = In._M_str;
  if (pcVar6 != pcVar5) {
    uVar3 = 4;
    if ((ulong)((long)pcVar5 - (long)pcVar6) < 4) {
      uVar3 = (long)pcVar5 - (long)pcVar6;
    }
    In_00._M_str = pcVar5 + -uVar3;
    In_00._M_len = uVar3;
    bVar1 = MatchWordBoundaryToRight(this,In_00);
    if (!bVar1) {
      return WORD_BOUNDARY_FAIL_START;
    }
  }
  pcVar6 = pcVar6 + (In._M_len - (long)(pcVar5 + Match._M_len));
  if (pcVar6 == (char *)0x0) {
    CVar2 = MATCH;
  }
  else {
    pcVar4 = (char *)0x4;
    if (pcVar6 < (char *)0x4) {
      pcVar4 = pcVar6;
    }
    In_01._M_str = pcVar5 + Match._M_len;
    In_01._M_len = (size_t)pcVar4;
    bVar1 = MatchWordBoundaryToLeft(this,In_01);
    CVar2 = (uint)!bVar1 << 2;
  }
  return CVar2;
}

Assistant:

CM_RETURN_STATUS ConfusableMatcher::CheckWordBoundary(CMStringView In, CMStringView Match)
{
	bool startPass = false, endPass = false;

	if (In.data() == Match.data()) {
		// Check if it is at the beginning of In
		startPass = true;
	} else {
		// Check for word boundary char that is touching left of Match, thus matching from left to right
		auto distToStart = std::min((size_t)4 /* Max 4 chars of largest codepoint */, (size_t)(Match.data() - In.data()));
		startPass = ConfusableMatcher::MatchWordBoundaryToRight(CMStringView(Match.data() - distToStart, distToStart));
	}

	if (!startPass)
		return WORD_BOUNDARY_FAIL_START;

	if (In.data() + In.size() == Match.data() + Match.size()) {
		// Check if it is at the end of In
		endPass = true;
	} else {
		// Check for word boundary char that is touching right of Match, thus matching from right to left
		auto matchEnd = (size_t)(Match.data() + Match.size());
		auto distToEnd = std::min((size_t)4 /* Max 4 chars of largest codepoint */, (size_t)In.data() + In.size() - matchEnd);
		endPass = ConfusableMatcher::MatchWordBoundaryToLeft(CMStringView(Match.data() + Match.size(), distToEnd));
	}

	if (!endPass)
		return WORD_BOUNDARY_FAIL_END;

	return MATCH;
}